

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O2

void __thiscall SFFile::~SFFile(SFFile *this)

{
  SFSample *pSVar1;
  long lVar2;
  int i;
  long lVar3;
  
  (this->super_FontFile)._vptr_FontFile = (_func_int **)&PTR__SFFile_006e97f0;
  if (this->Presets != (SFPreset *)0x0) {
    operator_delete__(this->Presets);
  }
  if (this->PresetBags != (SFBag *)0x0) {
    operator_delete__(this->PresetBags);
  }
  if (this->PresetGenerators != (SFGenList *)0x0) {
    operator_delete__(this->PresetGenerators);
  }
  if (this->Instruments != (SFInst *)0x0) {
    operator_delete__(this->Instruments);
  }
  if (this->InstrBags != (SFBag *)0x0) {
    operator_delete__(this->InstrBags);
  }
  if (this->InstrGenerators != (SFGenList *)0x0) {
    operator_delete__(this->InstrGenerators);
  }
  if (this->Samples != (SFSample *)0x0) {
    lVar2 = 0;
    for (lVar3 = 0; pSVar1 = this->Samples, lVar3 < this->NumSamples; lVar3 = lVar3 + 1) {
      if (*(void **)(pSVar1->Name + lVar2 + -0x22) != (void *)0x0) {
        operator_delete__(*(void **)(pSVar1->Name + lVar2 + -0x22));
      }
      lVar2 = lVar2 + 0x38;
    }
    if (pSVar1 != (SFSample *)0x0) {
      operator_delete__(pSVar1);
    }
  }
  TArray<SFPerc,_SFPerc>::~TArray(&this->Percussion);
  Timidity::FontFile::~FontFile(&this->super_FontFile);
  return;
}

Assistant:

SFFile::~SFFile()
{
	if (Presets != NULL)
	{
		delete[] Presets;
	}
	if (PresetBags != NULL)
	{
		delete[] PresetBags;
	}
	if (PresetGenerators != NULL)
	{
		delete[] PresetGenerators;
	}
	if (Instruments != NULL)
	{
		delete[] Instruments;
	}
	if (InstrBags != NULL)
	{
		delete[] InstrBags;
	}
	if (InstrGenerators != NULL)
	{
		delete[] InstrGenerators;
	}
	if (Samples != NULL)
	{
		for (int i = 0; i < NumSamples; ++i)
		{
			if (Samples[i].InMemoryData != NULL)
			{
				delete[] Samples[i].InMemoryData;
			}
		}
		delete[] Samples;
	}
}